

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

char * leveldb::GetVarint32PtrFallback(char *p,char *limit,uint32_t *value)

{
  byte bVar1;
  long lVar2;
  uint *in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  uint32_t byte;
  uint32_t shift;
  uint32_t result;
  uint local_30;
  uint local_2c;
  byte *local_18;
  byte *local_10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = 0;
  local_30 = 0;
  local_18 = in_RDI;
  do {
    if (0x1c < local_30 || in_RSI <= local_18) {
      local_10 = (byte *)0x0;
LAB_00d4d410:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return (char *)local_10;
      }
      __stack_chk_fail();
    }
    bVar1 = *local_18;
    local_18 = local_18 + 1;
    if ((bVar1 & 0x80) == 0) {
      *in_RDX = (uint)bVar1 << ((byte)local_30 & 0x1f) | local_2c;
      local_10 = local_18;
      goto LAB_00d4d410;
    }
    local_2c = (bVar1 & 0x7f) << ((byte)local_30 & 0x1f) | local_2c;
    local_30 = local_30 + 7;
  } while( true );
}

Assistant:

const char* GetVarint32PtrFallback(const char* p, const char* limit,
                                   uint32_t* value) {
  uint32_t result = 0;
  for (uint32_t shift = 0; shift <= 28 && p < limit; shift += 7) {
    uint32_t byte = *(reinterpret_cast<const uint8_t*>(p));
    p++;
    if (byte & 128) {
      // More bytes are present
      result |= ((byte & 127) << shift);
    } else {
      result |= (byte << shift);
      *value = result;
      return reinterpret_cast<const char*>(p);
    }
  }
  return nullptr;
}